

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix2 * matrix2_multiply(matrix2 *self,matrix2 *mT)

{
  undefined1 local_28 [8];
  matrix2 r;
  matrix2 *mT_local;
  matrix2 *self_local;
  
  r.field_0.field_1.m22[1] = (float  [2])mT;
  matrix2_identity((matrix2 *)local_28);
  local_28._0_4_ =
       (self->field_0).m[0] * *(float *)r.field_0.field_1.m22[1] +
       (self->field_0).m[2] * *(float *)((long)r.field_0.field_1.m22[1] + 4);
  local_28._4_4_ =
       (self->field_0).m[1] * *(float *)r.field_0.field_1.m22[1] +
       (self->field_0).m[3] * *(float *)((long)r.field_0.field_1.m22[1] + 4);
  r.field_0.m[0] =
       (self->field_0).m[0] * *(float *)((long)r.field_0.field_1.m22[1] + 8) +
       (self->field_0).m[2] * *(float *)((long)r.field_0.field_1.m22[1] + 0xc);
  r.field_0.m[1] =
       (self->field_0).m[1] * *(float *)((long)r.field_0.field_1.m22[1] + 8) +
       (self->field_0).m[3] * *(float *)((long)r.field_0.field_1.m22[1] + 0xc);
  matrix2_set(self,(matrix2 *)local_28);
  return self;
}

Assistant:

HYPAPI struct matrix2 *matrix2_multiply(struct matrix2 *self, const struct matrix2 *mT)
{
	/* mT is the multiplicand */

	struct matrix2 r;

	matrix2_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11;

	matrix2_set(self, &r); /* overwrite/save it */

	return self;
}